

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printVectorListTwoAllLanes(MCInst *MI,uint OpNum,SStream *O,MCRegisterInfo *MRI)

{
  byte bVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  uint uVar3;
  uint uVar4;
  uint id;
  MCOperand *op;
  uint8_t *puVar5;
  char *pcVar6;
  undefined4 in_register_00000034;
  SStream *ss;
  uint8_t uVar7;
  
  ss = (SStream *)CONCAT44(in_register_00000034,OpNum);
  op = MCInst_getOperand(MI,0);
  uVar3 = MCOperand_getReg(op);
  uVar4 = MCRegisterInfo_getSubReg((MCRegisterInfo *)O,uVar3,1);
  uVar3 = MCRegisterInfo_getSubReg((MCRegisterInfo *)O,uVar3,2);
  h = MI->csh;
  id = MCInst_getOpcode(MI);
  bVar1 = MI->ac_idx;
  puVar5 = ARM_get_op_access(h,id);
  uVar7 = puVar5[bVar1];
  if (puVar5[bVar1] == 0x80) {
    uVar7 = '\0';
  }
  SStream_concat0(ss,"{");
  pcVar6 = (*MI->csh->get_regname)(uVar4);
  SStream_concat0(ss,pcVar6);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar5 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
    puVar5[0] = '\x01';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) = uVar4;
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = uVar7;
    puVar5 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar5 = *puVar5 + '\x01';
  }
  SStream_concat0(ss,"[], ");
  pcVar6 = (*MI->csh->get_regname)(uVar3);
  SStream_concat0(ss,pcVar6);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar5 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x41;
    puVar5[0] = '\x01';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x45) = uVar3;
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)((uint)(pcVar2->field_6).arm.op_count * 0x30) + 0x5e] = uVar7;
    puVar5 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar5 = *puVar5 + '\x01';
  }
  SStream_concat0(ss,"[]}");
  MI->ac_idx = MI->ac_idx + '\x01';
  return;
}

Assistant:

static void printVectorListTwoAllLanes(MCInst *MI, unsigned OpNum,
		SStream *O, MCRegisterInfo *MRI)
{
#ifndef CAPSTONE_DIET
	uint8_t access;
#endif
	unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum));
	unsigned Reg0 = MCRegisterInfo_getSubReg(MRI, Reg, ARM_dsub_0);
	unsigned Reg1 = MCRegisterInfo_getSubReg(MRI, Reg, ARM_dsub_1);

#ifndef CAPSTONE_DIET
	access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
#endif

	SStream_concat0(O, "{");
	printRegName(MI->csh, O, Reg0);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = Reg0;
#ifndef CAPSTONE_DIET
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
#endif
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, "[], ");
	printRegName(MI->csh, O, Reg1);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = Reg1;
#ifndef CAPSTONE_DIET
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
#endif
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, "[]}");

#ifndef CAPSTONE_DIET
	MI->ac_idx++;
#endif
}